

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_engine_base.cpp
# Opt level: O3

int __thiscall zmq::stream_engine_base_t::decode_and_push(stream_engine_base_t *this,msg_t *msg_)

{
  byte bVar1;
  int iVar2;
  int *piVar3;
  mechanism_t *pmVar4;
  mechanism_t *local_20;
  
  pmVar4 = this->_mechanism;
  if (this->_mechanism == (mechanism_t *)0x0) {
    decode_and_push();
    pmVar4 = local_20;
  }
  iVar2 = (*pmVar4->_vptr_mechanism_t[5])(pmVar4,msg_);
  if (iVar2 != -1) {
    if (this->_has_timeout_timer == true) {
      this->_has_timeout_timer = false;
      io_object_t::cancel_timer(&this->super_io_object_t,0x81);
    }
    if (this->_has_ttl_timer == true) {
      this->_has_ttl_timer = false;
      io_object_t::cancel_timer(&this->super_io_object_t,0x82);
    }
    bVar1 = msg_t::flags(msg_);
    if ((bVar1 & 2) != 0) {
      (*(this->super_io_object_t).super_i_poll_events._vptr_i_poll_events[0x10])(this,msg_);
    }
    if (this->_metadata != (metadata_t *)0x0) {
      msg_t::set_metadata(msg_,this->_metadata);
    }
    iVar2 = (*(this->_session->super_own_t).super_object_t._vptr_object_t[0x1d])
                      (this->_session,msg_);
    if (iVar2 != -1) {
      return 0;
    }
    piVar3 = __errno_location();
    if (*piVar3 == 0xb) {
      this->_process_msg = (offset_in_stream_engine_base_t_to_subr)push_one_then_decode_and_push;
      *(undefined8 *)&this->field_0x560 = 0;
    }
  }
  return -1;
}

Assistant:

int zmq::stream_engine_base_t::decode_and_push (msg_t *msg_)
{
    zmq_assert (_mechanism != NULL);

    if (_mechanism->decode (msg_) == -1)
        return -1;

    if (_has_timeout_timer) {
        _has_timeout_timer = false;
        cancel_timer (heartbeat_timeout_timer_id);
    }

    if (_has_ttl_timer) {
        _has_ttl_timer = false;
        cancel_timer (heartbeat_ttl_timer_id);
    }

    if (msg_->flags () & msg_t::command) {
        process_command_message (msg_);
    }

    if (_metadata)
        msg_->set_metadata (_metadata);
    if (_session->push_msg (msg_) == -1) {
        if (errno == EAGAIN)
            _process_msg = &stream_engine_base_t::push_one_then_decode_and_push;
        return -1;
    }
    return 0;
}